

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.c
# Opt level: O2

void get_freq(ubyte iobyte)

{
  ulong uStack_8;
  
  if ((char)iobyte < '\0') {
    switch(iobyte >> 5 & 3) {
    case 0:
      get_freq::channel = '\x03';
      uStack_8 = 3;
      break;
    case 1:
      get_freq::channel = '\x02';
      uStack_8 = 2;
      break;
    case 2:
      get_freq::channel = '\x01';
      uStack_8 = 1;
      break;
    case 3:
      uStack_8 = (ulong)get_freq::channel;
    }
    freqbits[uStack_8] = (ushort)(iobyte & 0xf);
    return;
  }
  freqbits[get_freq::channel] = (ushort)(iobyte & 0x3f) << 4 | freqbits[get_freq::channel] & 0xf;
  return;
}

Assistant:

void get_freq(ubyte iobyte) {      // used to extract frequency data from
    // a byte
    static ubyte channel = 0xFF;

    if (iobyte & 0x80) {              // select channel

        switch (iobyte & 0x60) {
            case 0x00:
                channel = 3;
                break;
            case 0x20:
                channel = 2;
                break;
            case 0x40:
                channel = 1;
                break;
        }

        freqbits[channel] &= 0;             // update high order bits of channel
        freqbits[channel] |= (iobyte & 0xF);
    }

    if (!(iobyte & 0x80)) {          // if a `low order' frequency byte

        freqbits[channel] &= 0x000F;
        freqbits[channel] |= (((uint) (iobyte & 0x3F)) << 4); // update low order bits
    }
}